

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseMetaValue
          (AsciiParser *this,VariableDef *def,MetaVariable *outvar)

{
  pointer pcVar1;
  MetaVariable *this_00;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args;
  ulong uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  AsciiParser *this_01;
  string *in;
  bool bVar10;
  bool bVar11;
  vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> arrs;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> paths;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> vss;
  string vartype;
  string varname;
  MetaVariable var;
  token val;
  char c;
  string local_3f8;
  AsciiParser *local_3d0;
  undefined1 local_3c8 [20];
  undefined2 uStack_3b4;
  undefined1 uStack_3b2;
  undefined1 uStack_3b1;
  undefined2 local_3b0;
  undefined1 local_3ae;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  string local_380;
  size_type *local_360 [2];
  size_type local_350 [2];
  storage_union local_340;
  undefined **local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  undefined8 local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined1 local_308 [4];
  float fStack_304;
  undefined1 auStack_300 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f0;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined1 auStack_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 auStack_298 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [10];
  long *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  long local_1a0 [12];
  ios_base local_140 [264];
  MetaVariable *local_38;
  
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  pcVar1 = (def->type)._M_dataplus._M_p;
  local_3d0 = this;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_380,pcVar1,pcVar1 + (def->type)._M_string_length);
  local_360[0] = local_350;
  pcVar1 = (def->name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar1,pcVar1 + (def->name)._M_string_length);
  local_328 = &local_318;
  local_330 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  bVar10 = false;
  local_340.dynamic = (void *)0x0;
  local_320 = 0;
  local_318._M_local_buf[0] = '\0';
  local_1b0 = local_1a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"[]","");
  pbVar6 = local_1a8;
  if (local_1a8 <= local_380._M_string_length) {
    lVar4 = ::std::__cxx11::string::find
                      ((char *)&local_380,(ulong)local_1b0,
                       local_380._M_string_length - (long)local_1a8);
    bVar10 = lVar4 != -1;
    pbVar6 = local_1a8;
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  this_01 = local_3d0;
  if (bVar10) {
    _local_308 = (pointer)(auStack_300 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"[]","");
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(auStack_300._4_4_,auStack_300._0_4_);
    if (local_380._M_string_length < pbVar6) {
LAB_0037933f:
      local_1b0 = local_1a0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b0,local_380._M_dataplus._M_p,
                 local_380._M_dataplus._M_p +
                 (long)&((_Alloc_hider *)local_380._M_string_length)->_M_p);
    }
    else {
      lVar4 = ::std::__cxx11::string::find
                        ((char *)&local_380,(ulong)_local_308,
                         local_380._M_string_length - (long)pbVar6);
      if (lVar4 == -1) goto LAB_0037933f;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_380._M_string_length - CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
      ::std::__cxx11::string::substr((ulong)&local_1b0,(ulong)&local_380);
    }
    ::std::__cxx11::string::operator=((string *)&local_380,(string *)&local_1b0);
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0,local_1a0[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_308 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(auStack_300 + 8)) {
      operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
    }
    bVar10 = true;
    this_01 = local_3d0;
  }
  else if (def->allow_array_type == true) {
    bVar10 = LookChar1(local_3d0,(char *)&local_1b0);
    bVar10 = local_1b0._0_1_ == (string)0x5b && bVar10;
  }
  else {
    bVar10 = false;
  }
  in = &def->name;
  uVar2 = tinyusdz::value::GetTypeId(&local_380);
  iVar3 = ::std::__cxx11::string::compare((char *)&local_380);
  local_38 = outvar;
  if (iVar3 == 0) {
    if (bVar10) {
      local_3c8._0_8_ = (pointer)0x0;
      local_3c8._8_8_ = (pointer)0x0;
      stack0xfffffffffffffc48 = (pointer)0x0;
      bVar10 = ParseBasicTypeArray<tinyusdz::Reference>
                         (this_01,(vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>
                                   *)local_3c8);
      if (bVar10) {
        MetaVariable::
        set_value<std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>
                  ((MetaVariable *)&local_340,
                   (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_3c8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xa84);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse `{}` in Prim metadataum.","");
        fmt::format<std::__cxx11::string>((string *)local_308,(fmt *)&local_3f8,(string *)in,pbVar6)
        ;
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,_local_308,
                            CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      ::std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
                ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_3c8);
    }
    else {
      local_308 = (undefined1  [4])((uint)local_308 & 0xffffff00);
      memset((Reference *)auStack_300,0,0x150);
      bVar10 = ReadBasicType(this_01,(optional<tinyusdz::Reference> *)local_308);
      if (bVar10) {
        if (local_308[0] == (string)0x1) {
          MetaVariable::set_value<tinyusdz::Reference>
                    ((MetaVariable *)&local_340,(Reference *)auStack_300);
        }
        else {
          MetaVariable::set_value<tinyusdz::value::ValueBlock>
                    ((MetaVariable *)&local_340,(ValueBlock *)&local_1b0);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xa8c);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,"Failed to parse `{}` in Prim metadataum.","");
        fmt::format<std::__cxx11::string>(&local_3f8,(fmt *)local_3c8,(string *)in,pbVar6);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,
                            local_3f8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      bVar11 = local_308[0] == (string)0x1;
      _local_308 = (pointer)CONCAT44(fStack_304,local_308);
      if (bVar11) {
        nonstd::optional_lite::detail::storage_t<tinyusdz::Reference>::destruct_value
                  ((storage_t<tinyusdz::Reference> *)auStack_300);
      }
    }
    goto LAB_003820b6;
  }
  iVar3 = ::std::__cxx11::string::compare((char *)&local_380);
  if (iVar3 == 0) {
    if (bVar10) {
      local_3c8._0_8_ = (pointer)0x0;
      local_3c8._8_8_ = (pointer)0x0;
      stack0xfffffffffffffc48 = (pointer)0x0;
      bVar10 = ParseBasicTypeArray<tinyusdz::Payload>
                         (this_01,(vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)
                                  local_3c8);
      if (bVar10) {
        MetaVariable::set_value<std::vector<tinyusdz::Payload,std::allocator<tinyusdz::Payload>>>
                  ((MetaVariable *)&local_340,
                   (vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_3c8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xa9b);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse `{}` in Prim metadataum.","");
        fmt::format<std::__cxx11::string>((string *)local_308,(fmt *)&local_3f8,(string *)in,pbVar6)
        ;
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,_local_308,
                            CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::~vector
                ((vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *)local_3c8);
    }
    else {
      local_308 = (undefined1  [4])((uint)local_308 & 0xffffff00);
      memset((Payload *)auStack_300,0,0x120);
      bVar10 = ReadBasicType(this_01,(optional<tinyusdz::Payload> *)local_308);
      if (bVar10) {
        if (local_308[0] == (string)0x1) {
          MetaVariable::set_value<tinyusdz::Payload>
                    ((MetaVariable *)&local_340,(Payload *)auStack_300);
        }
        else {
          MetaVariable::set_value<tinyusdz::value::ValueBlock>
                    ((MetaVariable *)&local_340,(ValueBlock *)&local_1b0);
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xaa3);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,"Failed to parse `{}` in Prim metadataum.","");
        fmt::format<std::__cxx11::string>(&local_3f8,(fmt *)local_3c8,(string *)in,pbVar6);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,
                            local_3f8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      bVar11 = local_308[0] == (string)0x1;
      _local_308 = (pointer)CONCAT44(fStack_304,local_308);
      if (bVar11) {
        nonstd::optional_lite::detail::storage_t<tinyusdz::Payload>::destruct_value
                  ((storage_t<tinyusdz::Payload> *)auStack_300);
        _local_308 = (pointer)CONCAT44(fStack_304,local_308);
      }
    }
    goto LAB_003820b6;
  }
  iVar3 = ::std::__cxx11::string::compare((char *)&local_380);
  if (iVar3 == 0) {
    if (bVar10) {
      local_3c8._0_8_ = (pointer)0x0;
      local_3c8._8_8_ = (pointer)0x0;
      stack0xfffffffffffffc48 = (pointer)0x0;
      bVar10 = ParseBasicTypeArray<tinyusdz::Path>
                         (this_01,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                  local_3c8);
      if (bVar10) {
        MetaVariable::set_value<std::vector<tinyusdz::Path,std::allocator<tinyusdz::Path>>>
                  ((MetaVariable *)&local_340,
                   (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3c8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xab2);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse `{}` in Prim metadatum.","");
        fmt::format<std::__cxx11::string>((string *)local_308,(fmt *)&local_3f8,(string *)in,pbVar6)
        ;
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,_local_308,
                            CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3c8);
    }
    else {
      _local_308 = auStack_300 + 8;
      auStack_300._0_4_ = 0;
      auStack_300._4_4_ = 0;
      auStack_300._8_4_ = (uint)(uint3)auStack_300._9_3_ << 8;
      aStack_2f0._8_8_ = auStack_2d8;
      local_2e0 = 0;
      uStack_2dc = 0;
      auStack_2d8._0_4_ = (uint)(uint3)auStack_2d8._1_3_ << 8;
      auStack_2d8._16_8_ = local_2b8;
      auStack_2d8._24_8_ = (pointer)0x0;
      local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
      local_2b8._16_8_ = auStack_298;
      local_2b8._24_8_ = (pointer)0x0;
      auStack_298._0_8_ = auStack_298._0_8_ & 0xffffffffffffff00;
      args = local_278;
      auStack_298._24_8_ = (pointer)0x0;
      local_278[0]._M_local_buf[0] = '\0';
      local_278[1]._8_8_ = (pointer)0x0;
      local_258[0]._M_local_buf[0] = '\0';
      local_258[1]._M_local_buf[0] = '\0';
      local_258[1]._4_4_ = 0;
      local_258[1]._8_1_ = 0;
      auStack_298._16_8_ = args;
      local_278[1]._0_8_ = local_258;
      bVar10 = ReadBasicType(this_01,(Path *)local_308);
      if (bVar10) {
        MetaVariable::set_value<tinyusdz::Path>((MetaVariable *)&local_340,(Path *)local_308);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xabb);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3c8._0_8_ = local_3c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,"Failed to parse `{}` in Prim metadatum.","");
        fmt::format<std::__cxx11::string>
                  (&local_3f8,(fmt *)local_3c8,(string *)in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,
                            local_3f8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278[1]._0_8_ != local_258) {
        operator_delete((void *)local_278[1]._0_8_,
                        CONCAT71(local_258[0]._M_allocated_capacity._1_7_,
                                 local_258[0]._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_298._16_8_ != local_278) {
        operator_delete((void *)auStack_298._16_8_,
                        CONCAT71(local_278[0]._M_allocated_capacity._1_7_,
                                 local_278[0]._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_2b8._16_8_ != auStack_298) {
        operator_delete((void *)local_2b8._16_8_,auStack_298._0_8_ + 1);
      }
      if ((undefined1 *)auStack_2d8._16_8_ != local_2b8) {
        operator_delete((void *)auStack_2d8._16_8_,local_2b8._0_8_ + 1);
      }
      if ((undefined1 *)aStack_2f0._8_8_ != auStack_2d8) {
        operator_delete((void *)aStack_2f0._8_8_,CONCAT44(auStack_2d8._4_4_,auStack_2d8._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_308 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(auStack_300 + 8)) {
LAB_0037a214:
        uVar7 = CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1;
        uVar8 = _local_308;
LAB_00381ed3:
        operator_delete((void *)uVar8,uVar7);
      }
    }
    goto LAB_003820b6;
  }
  if (0x4c < uVar2 - 6) {
switchD_00379436_caseD_8:
    _local_308 = (pointer)(auStack_300 + 8);
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_308,local_380._M_dataplus._M_p,
               local_380._M_dataplus._M_p +
               (long)&((_Alloc_hider *)local_380._M_string_length)->_M_p);
    if (bVar10) {
      ::std::__cxx11::string::append(local_308);
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"ParseMetaValue",0xe)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
    poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xaf2);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    ::std::operator+(&local_3f8,"Unsupported or invalid type for Metadatum:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308)
    ;
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,local_3f8._M_string_length)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(local_3d0,(string *)&local_3f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    ::std::ios_base::~ios_base(local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_308 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(auStack_300 + 8)) {
      operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
    }
    bVar10 = false;
    goto LAB_003820ea;
  }
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&switchD_00379436::switchdataD_00409914 +
           (long)(int)(&switchD_00379436::switchdataD_00409914)[uVar2 - 6]);
  switch(uVar2) {
  case 6:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::Token>
                         (this_01,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  &local_3a8);
      if (bVar10) {
        MetaVariable::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                  ((MetaVariable *)&local_340,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_3a8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x6e656b6f74;
        local_3c8._8_8_ = (pointer)0x5;
        local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
        fmt::format<std::__cxx11::string>
                  ((string *)local_308,(fmt *)&local_3f8,(string *)local_3c8,pbVar6);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,_local_308,
                            CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_3a8);
      break;
    }
    auStack_300._0_4_ = 0;
    auStack_300._4_4_ = 0;
    auStack_300._8_4_ = (uint)(uint3)auStack_300._9_3_ << 8;
    _local_308 = (pointer)(auStack_300 + 8);
    bVar10 = ReadBasicType(this_01,(token *)local_308);
    if (bVar10) {
      MetaVariable::set_value<tinyusdz::Token>((MetaVariable *)&local_340,(Token *)local_308);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity._0_6_ = 0x6e656b6f74;
      local_3a8._8_8_ = 5;
      local_3a8._M_allocated_capacity = (size_type)&local_398;
      fmt::format<std::__cxx11::string>(&local_3f8,(fmt *)local_3c8,(string *)&local_3a8,pbVar6);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,
                          local_3f8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity != &local_398) {
        operator_delete((void *)local_3a8._M_allocated_capacity,local_398._M_allocated_capacity + 1)
        ;
      }
      if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
      }
      ::std::__cxx11::stringbuf::str();
      PushError(local_3d0,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
      ::std::ios_base::~ios_base(local_140);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_308 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(auStack_300 + 8)) {
      operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
    }
    if (!bVar10) goto LAB_0037ef38;
    goto LAB_003820bf;
  case 7:
    if (bVar10) {
      local_3f8._M_dataplus._M_p = (pointer)0x0;
      local_3f8._M_string_length = 0;
      local_3f8.field_2._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::__cxx11::string>
                         (this_01,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_3f8);
      if (bVar10) {
        MetaVariable::
        set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((MetaVariable *)&local_340,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_3f8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Failed to parse `string[]`",0x1a);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_01,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3f8);
    }
    else {
      auStack_300._0_4_ = 0;
      auStack_300._4_4_ = 0;
      auStack_300._8_4_ = (uint)(uint3)auStack_300._9_3_ << 8;
      _local_308 = (pointer)(auStack_300 + 8);
      bVar10 = ReadBasicType(this_01,(string *)local_308);
      if (bVar10) {
        MetaVariable::set_value<std::__cxx11::string>
                  ((MetaVariable *)&local_340,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xacc);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Failed to parse `string`",0x18);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_01,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_308 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(auStack_300 + 8)) goto LAB_0037a214;
    }
    break;
  default:
    goto switchD_00379436_caseD_8;
  case 9:
    if (bVar10) {
      local_308 = (undefined1  [4])0x0;
      fStack_304 = 0.0;
      auStack_300._0_4_ = 0;
      auStack_300._8_4_ = 0;
      auStack_300._12_4_ = 0;
      aStack_2f0._M_allocated_capacity = aStack_2f0._M_allocated_capacity & 0xffffffff00000000;
      aStack_2f0._8_8_ = (undefined1 *)0x0;
      bVar10 = ParseBasicTypeArray<bool>(this_01,(vector<bool,_std::allocator<bool>_> *)local_308);
      if (bVar10) {
        MetaVariable::set_value<std::vector<bool,std::allocator<bool>>>
                  ((MetaVariable *)&local_340,(vector<bool,_std::allocator<bool>_> *)local_308);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3c8,"Failed to parse a value of type `{}[]`","");
        local_3a8._8_8_ = 4;
        local_398._M_allocated_capacity._0_5_ = 0x6c6f6f62;
        local_3a8._M_allocated_capacity = (size_type)&local_398;
        fmt::format<std::__cxx11::string>(&local_3f8,(fmt *)local_3c8,(string *)&local_3a8,pbVar6);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,
                            local_3f8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_allocated_capacity != &local_398) {
          operator_delete((void *)local_3a8._M_allocated_capacity,
                          local_398._M_allocated_capacity + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_308 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(_local_308,aStack_2f0._8_8_ - (long)_local_308);
        _local_308 = (pointer)0x0;
        auStack_300._0_4_ = 0;
        auStack_300._8_4_ = 0;
        auStack_300._12_4_ = 0;
        aStack_2f0._M_allocated_capacity = aStack_2f0._M_allocated_capacity & 0xffffffff00000000;
        aStack_2f0._8_8_ = (undefined1 *)0x0;
      }
    }
    else {
      bVar10 = ReadBasicType(this_01,(bool *)local_3a8._M_local_buf);
      if (bVar10) {
        MetaVariable::set_value<bool>((MetaVariable *)&local_340,(bool *)local_3a8._M_local_buf);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
        local_3c8._16_4_ = 0x6c6f6f62;
LAB_003805f0:
        local_3c8._8_8_ = (pointer)0x4;
        uStack_3b4._0_1_ = 0;
LAB_00381fc0:
        local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
        fmt::format<std::__cxx11::string>
                  ((string *)local_308,(fmt *)&local_3f8,(string *)local_3c8,pbVar6);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,_local_308,
                            CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          uVar8 = CONCAT44(auStack_300._12_4_,auStack_300._8_4_);
          _Var9._M_p = _local_308;
LAB_0038208d:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
LAB_00382095:
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
    }
    break;
  case 0xe:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::half>
                         (this_01,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                                   *)&local_3a8);
      if (bVar10) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                  ((MetaVariable *)&local_340,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   &local_3a8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x666c6168;
LAB_00380515:
        local_3c8._8_8_ = (pointer)0x4;
        uStack_3b4._0_1_ = 0;
LAB_00381dc7:
        local_3c8._0_8_ = (pointer)(local_3c8 + 0x10);
        fmt::format<std::__cxx11::string>
                  ((string *)local_308,(fmt *)&local_3f8,(string *)local_3c8,pbVar6);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b0,_local_308,
                            CONCAT44(auStack_300._4_4_,auStack_300._0_4_));
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
          operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::stringbuf::str();
        PushError(local_3d0,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
LAB_00381ebd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        uVar7 = local_398._M_allocated_capacity - local_3a8._0_8_;
        uVar8 = local_3a8._M_allocated_capacity;
        goto LAB_00381ed3;
      }
    }
    else {
      bVar10 = ReadBasicType(this_01,(half *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
        local_3c8._16_4_ = 0x666c6168;
        goto LAB_003805f0;
      }
      MetaVariable::set_value<tinyusdz::value::half>((MetaVariable *)&local_340,(half *)&local_3a8);
    }
    break;
  case 0xf:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<int>(this_01,(vector<int,_std::allocator<int>_> *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x746e69;
        local_3c8._8_8_ = (pointer)0x3;
        goto LAB_00381dc7;
      }
      MetaVariable::set_value<std::vector<int,std::allocator<int>>>
                ((MetaVariable *)&local_340,(vector<int,_std::allocator<int>_> *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(int *)local_3a8._M_local_buf);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x746e69;
      local_3c8._8_8_ = (pointer)0x3;
      goto LAB_00381fc0;
    }
    MetaVariable::set_value<int>((MetaVariable *)&local_340,(int *)local_3a8._M_local_buf);
    break;
  case 0x10:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<long>(this_01,(vector<long,_std::allocator<long>_> *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x36746e69;
LAB_003806cb:
        uStack_3b4 = 0x34;
LAB_00381294:
        local_3c8._8_8_ = (pointer)0x5;
        goto LAB_00381dc7;
      }
      MetaVariable::set_value<std::vector<long,std::allocator<long>>>
                ((MetaVariable *)&local_340,(vector<long,_std::allocator<long>_> *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(int64_t *)local_3a8._M_local_buf);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x36746e69;
LAB_003807a0:
      uStack_3b4 = 0x34;
LAB_00381371:
      local_3c8._8_8_ = (pointer)0x5;
      goto LAB_00381fc0;
    }
    MetaVariable::set_value<long>((MetaVariable *)&local_340,(long *)local_3a8._M_local_buf);
    break;
  case 0x11:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<tinyusdz::value::half,2ul>>
                         (this_01,(vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x666c6168;
LAB_0037f008:
        uStack_3b4 = 0x32;
        goto LAB_00381294;
      }
      MetaVariable::
      set_value<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(half2 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x666c6168;
LAB_0037f0dd:
      uStack_3b4 = 0x32;
      goto LAB_00381371;
    }
    MetaVariable::set_value<std::array<tinyusdz::value::half,2ul>>
              ((MetaVariable *)&local_340,(array<tinyusdz::value::half,_2UL> *)&local_3a8);
    break;
  case 0x12:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<tinyusdz::value::half,3ul>>
                         (this_01,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x666c6168;
LAB_0037f1b2:
        uStack_3b4 = 0x33;
        goto LAB_00381294;
      }
      MetaVariable::
      set_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(half3 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x666c6168;
LAB_0037f287:
      uStack_3b4 = 0x33;
      goto LAB_00381371;
    }
    MetaVariable::set_value<std::array<tinyusdz::value::half,3ul>>
              ((MetaVariable *)&local_340,(array<tinyusdz::value::half,_3UL> *)&local_3a8);
    break;
  case 0x13:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<tinyusdz::value::half,4ul>>
                         (this_01,(vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x666c6168;
        goto LAB_003806cb;
      }
      MetaVariable::
      set_value<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(half4 *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x666c6168;
      goto LAB_003807a0;
    }
    MetaVariable::set_value<std::array<tinyusdz::value::half,4ul>>
              ((MetaVariable *)&local_340,
               (array<tinyusdz::value::half,_4UL> *)&local_3a8._M_allocated_capacity);
    break;
  case 0x14:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<int,2ul>>
                         (this_01,(vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x32746e69;
        goto LAB_00380515;
      }
      MetaVariable::set_value<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)&local_3a8)
      ;
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(int2 *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x32746e69;
      goto LAB_003805f0;
    }
    MetaVariable::set_value<std::array<int,2ul>>
              ((MetaVariable *)&local_340,(array<int,_2UL> *)&local_3a8._M_allocated_capacity);
    break;
  case 0x15:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<int,3ul>>
                         (this_01,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x33746e69;
        goto LAB_00380515;
      }
      MetaVariable::set_value<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&local_3a8)
      ;
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(int3 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x33746e69;
      goto LAB_003805f0;
    }
    MetaVariable::set_value<std::array<int,3ul>>
              ((MetaVariable *)&local_340,(array<int,_3UL> *)&local_3a8);
    break;
  case 0x16:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<int,4ul>>
                         (this_01,(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x34746e69;
        goto LAB_00380515;
      }
      MetaVariable::set_value<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&local_3a8)
      ;
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(int4 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x34746e69;
      goto LAB_003805f0;
    }
    MetaVariable::set_value<std::array<int,4ul>>
              ((MetaVariable *)&local_340,(array<int,_4UL> *)&local_3a8);
    break;
  case 0x1b:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<unsigned_int>
                         (this_01,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8)
      ;
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x746e6975;
        goto LAB_00380515;
      }
      MetaVariable::set_value<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((MetaVariable *)&local_340,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(uint32_t *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x746e6975;
      goto LAB_003805f0;
    }
    MetaVariable::set_value<unsigned_int>
              ((MetaVariable *)&local_340,(uint *)&local_3a8._M_allocated_capacity);
    break;
  case 0x1c:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<unsigned_long>
                         (this_01,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x3436746e6975;
LAB_00380f1c:
        local_3c8._8_8_ = (pointer)0x6;
        uStack_3b2 = 0;
        goto LAB_00381dc7;
      }
      MetaVariable::set_value<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((MetaVariable *)&local_340,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x3436746e6975;
LAB_00380ffe:
      local_3c8._8_8_ = (pointer)0x6;
      uStack_3b2 = 0;
      goto LAB_00381fc0;
    }
    MetaVariable::set_value<unsigned_long>
              ((MetaVariable *)&local_340,&local_3a8._M_allocated_capacity);
    break;
  case 0x25:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<unsigned_int,2ul>>
                         (this_01,(vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x746e6975;
        goto LAB_0037f008;
      }
      MetaVariable::
      set_value<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(uint2 *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x746e6975;
      goto LAB_0037f0dd;
    }
    MetaVariable::set_value<std::array<unsigned_int,2ul>>
              ((MetaVariable *)&local_340,
               (array<unsigned_int,_2UL> *)&local_3a8._M_allocated_capacity);
    break;
  case 0x26:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<unsigned_int,3ul>>
                         (this_01,(vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x746e6975;
        goto LAB_0037f1b2;
      }
      MetaVariable::
      set_value<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(uint3 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x746e6975;
      goto LAB_0037f287;
    }
    MetaVariable::set_value<std::array<unsigned_int,3ul>>
              ((MetaVariable *)&local_340,(array<unsigned_int,_3UL> *)&local_3a8);
    break;
  case 0x27:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<unsigned_int,4ul>>
                         (this_01,(vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3c8._16_4_ = 0x746e6975;
        goto LAB_003806cb;
      }
      MetaVariable::
      set_value<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(uint4 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3c8._16_4_ = 0x746e6975;
      goto LAB_003807a0;
    }
    MetaVariable::set_value<std::array<unsigned_int,4ul>>
              ((MetaVariable *)&local_340,(array<unsigned_int,_4UL> *)&local_3a8);
    break;
  case 0x28:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<float>
                         (this_01,(vector<float,_std::allocator<float>_> *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x74616f6c66;
        goto LAB_00381294;
      }
      MetaVariable::set_value<std::vector<float,std::allocator<float>>>
                ((MetaVariable *)&local_340,(vector<float,_std::allocator<float>_> *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(float *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x74616f6c66;
      goto LAB_00381371;
    }
    MetaVariable::set_value<float>((MetaVariable *)&local_340,(float *)&local_3a8);
    break;
  case 0x29:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<float,2ul>>
                         (this_01,(vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x3274616f6c66;
        goto LAB_00380f1c;
      }
      MetaVariable::
      set_value<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(float2 *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x3274616f6c66;
      goto LAB_00380ffe;
    }
    MetaVariable::set_value<std::array<float,2ul>>
              ((MetaVariable *)&local_340,(array<float,_2UL> *)&local_3a8._M_allocated_capacity);
    break;
  case 0x2a:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<float,3ul>>
                         (this_01,(vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x3374616f6c66;
        goto LAB_00380f1c;
      }
      MetaVariable::
      set_value<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(float3 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x3374616f6c66;
      goto LAB_00380ffe;
    }
    MetaVariable::set_value<std::array<float,3ul>>
              ((MetaVariable *)&local_340,(array<float,_3UL> *)&local_3a8);
    break;
  case 0x2b:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<float,4ul>>
                         (this_01,(vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x3474616f6c66;
        goto LAB_00380f1c;
      }
      MetaVariable::
      set_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(float4 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x3474616f6c66;
      goto LAB_00380ffe;
    }
    MetaVariable::set_value<std::array<float,4ul>>
              ((MetaVariable *)&local_340,(array<float,_4UL> *)&local_3a8);
    break;
  case 0x2c:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<double>
                         (this_01,(vector<double,_std::allocator<double>_> *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x656c62756f64;
        goto LAB_00380f1c;
      }
      MetaVariable::set_value<std::vector<double,std::allocator<double>>>
                ((MetaVariable *)&local_340,(vector<double,_std::allocator<double>_> *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(double *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x656c62756f64;
      goto LAB_00380ffe;
    }
    MetaVariable::set_value<double>
              ((MetaVariable *)&local_340,(double *)&local_3a8._M_allocated_capacity);
    break;
  case 0x2d:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<double,2ul>>
                         (this_01,(vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x32656c62756f64;
LAB_00381605:
        local_3c8._8_8_ = (pointer)0x7;
        goto LAB_00381dc7;
      }
      MetaVariable::
      set_value<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(double2 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x32656c62756f64;
LAB_003816e8:
      local_3c8._8_8_ = (pointer)0x7;
      goto LAB_00381fc0;
    }
    MetaVariable::set_value<std::array<double,2ul>>
              ((MetaVariable *)&local_340,(array<double,_2UL> *)&local_3a8);
    break;
  case 0x2e:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<double,3ul>>
                         (this_01,(vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x33656c62756f64;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(double3 *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x33656c62756f64;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<std::array<double,3ul>>
              ((MetaVariable *)&local_340,(array<double,_3UL> *)&local_3a8);
    break;
  case 0x2f:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<std::array<double,4ul>>
                         (this_01,(vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x34656c62756f64;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                ((MetaVariable *)&local_340,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(double4 *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity._0_7_ = 0x34656c62756f64;
LAB_0037fd8e:
      local_3a8._8_8_ = 7;
      local_398._M_local_buf[7] = 0;
LAB_003818a8:
      local_3a8._M_allocated_capacity = (size_type)&local_398;
      fmt::format<std::__cxx11::string>(&local_3f8,(fmt *)local_3c8,(string *)&local_3a8,pbVar6);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1b0,local_3f8._M_dataplus._M_p,
                          local_3f8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_allocated_capacity != &local_398) {
        operator_delete((void *)local_3a8._M_allocated_capacity,local_398._M_allocated_capacity + 1)
        ;
      }
      if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
        operator_delete((void *)local_3c8._0_8_,(ulong)(stack0xfffffffffffffc48 + 1));
      }
      ::std::__cxx11::stringbuf::str();
      PushError(local_3d0,(string *)&local_3f8);
      uVar8 = local_3f8.field_2._M_allocated_capacity;
      _Var9._M_p = local_3f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) goto LAB_0038208d;
      goto LAB_00382095;
    }
    MetaVariable::set_value<std::array<double,4ul>>
              ((MetaVariable *)&local_340,(array<double,_4UL> *)local_308);
    break;
  case 0x30:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::quath>
                         (this_01,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x6874617571;
        goto LAB_00381294;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(quath *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x6874617571;
      goto LAB_00381371;
    }
    MetaVariable::set_value<tinyusdz::value::quath>
              ((MetaVariable *)&local_340,(quath *)&local_3a8._M_allocated_capacity);
    break;
  case 0x31:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::quatf>
                         (this_01,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x6674617571;
        goto LAB_00381294;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(quatf *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = 0x6674617571;
      goto LAB_00381371;
    }
    MetaVariable::set_value<tinyusdz::value::quatf>((MetaVariable *)&local_340,(quatf *)&local_3a8);
    break;
  case 0x32:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::quatd>
                         (this_01,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = 0x6474617571;
        goto LAB_00381294;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(quatd *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity._0_6_ = 0x6474617571;
      local_3a8._8_8_ = 5;
      goto LAB_003818a8;
    }
    MetaVariable::set_value<tinyusdz::value::quatd>((MetaVariable *)&local_340,(quatd *)local_308);
    break;
  case 0x33:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::matrix2f>
                         (this_01,(vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x663278697274616d;
LAB_00381bed:
        local_3c8._8_8_ = (pointer)0x8;
        local_3b0 = (ushort)(byte)local_3b0._1_1_ << 8;
        goto LAB_00381dc7;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::matrix2f,std::allocator<tinyusdz::value::matrix2f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::matrix2f,_std::allocator<tinyusdz::value::matrix2f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    local_3a8._M_allocated_capacity = 0x3f800000;
    local_3a8._8_8_ = 0x3f80000000000000;
    bVar10 = ReadBasicType(this_01,(matrix2f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x663278697274616d;
LAB_00381cce:
      local_3c8._8_8_ = (pointer)0x8;
      local_3b0 = (ushort)(byte)local_3b0._1_1_ << 8;
      goto LAB_00381fc0;
    }
    MetaVariable::set_value<tinyusdz::value::matrix2f>
              ((MetaVariable *)&local_340,(matrix2f *)&local_3a8);
    break;
  case 0x34:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::matrix3f>
                         (this_01,(vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x663378697274616d;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::matrix3f,std::allocator<tinyusdz::value::matrix3f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::matrix3f,_std::allocator<tinyusdz::value::matrix3f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    local_308 = (undefined1  [4])0x3f800000;
    fStack_304 = 0.0;
    auStack_300._0_4_ = 0;
    auStack_300._4_4_ = 0;
    auStack_300._8_4_ = 0x3f800000;
    auStack_300._12_4_ = 0;
    aStack_2f0._M_allocated_capacity = 0;
    aStack_2f0._8_4_ = 0x3f800000;
    bVar10 = ReadBasicType(this_01,(matrix3f *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity = 0x663378697274616d;
LAB_00381897:
      local_3a8._8_8_ = 8;
      local_398._M_local_buf[8] = '\0';
      goto LAB_003818a8;
    }
    MetaVariable::set_value<tinyusdz::value::matrix3f>
              ((MetaVariable *)&local_340,(matrix3f *)local_308);
    break;
  case 0x35:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::matrix4f>
                         (this_01,(vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x663478697274616d;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::matrix4f,std::allocator<tinyusdz::value::matrix4f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::matrix4f,_std::allocator<tinyusdz::value::matrix4f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    local_308 = (undefined1  [4])0x3f800000;
    fStack_304 = 0.0;
    auStack_300._0_4_ = 0;
    auStack_300._4_4_ = 0;
    auStack_300._8_4_ = 0;
    auStack_300._12_4_ = 0x3f800000;
    aStack_2f0._M_allocated_capacity = 0;
    aStack_2f0._8_8_ = (undefined1 *)0x0;
    local_2e0 = 0x3f800000;
    uStack_2dc = 0;
    auStack_2d8._0_4_ = 0;
    auStack_2d8._4_4_ = 0;
    auStack_2d8._8_4_ = 0;
    auStack_2d8._12_4_ = 0x3f800000;
    bVar10 = ReadBasicType(this_01,(matrix4f *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity = 0x663478697274616d;
      goto LAB_00381897;
    }
    MetaVariable::set_value<tinyusdz::value::matrix4f>
              ((MetaVariable *)&local_340,(matrix4f *)local_308);
    break;
  case 0x36:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::matrix2d>
                         (this_01,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x643278697274616d;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    local_308 = (undefined1  [4])0x0;
    fStack_304 = 1.875;
    auStack_300._0_4_ = 0;
    auStack_300._4_4_ = 0;
    auStack_300._8_4_ = 0;
    auStack_300._12_4_ = 0;
    aStack_2f0._M_allocated_capacity = 0x3ff0000000000000;
    bVar10 = ReadBasicType(this_01,(matrix2d *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity = 0x643278697274616d;
      goto LAB_00381897;
    }
    MetaVariable::set_value<tinyusdz::value::matrix2d>
              ((MetaVariable *)&local_340,(matrix2d *)local_308);
    break;
  case 0x37:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::matrix3d>
                         (this_01,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x643378697274616d;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    local_308 = (undefined1  [4])0x0;
    fStack_304 = 1.875;
    auStack_300._0_4_ = 0;
    auStack_300._4_4_ = 0;
    auStack_300._8_4_ = 0;
    auStack_300._12_4_ = 0;
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    aStack_2f0._M_allocated_capacity = 0;
    aStack_2f0._8_8_ = (undefined1 *)0x3ff0000000000000;
    local_2e0 = 0;
    uStack_2dc = 0;
    auStack_2d8._0_4_ = 0;
    auStack_2d8._4_4_ = 0;
    auStack_2d8._8_4_ = 0;
    auStack_2d8._12_4_ = 0;
    auStack_2d8._16_8_ = (undefined1 *)0x3ff0000000000000;
    bVar10 = ReadBasicType(this_01,(matrix3d *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity = 0x643378697274616d;
      goto LAB_00381897;
    }
    MetaVariable::set_value<tinyusdz::value::matrix3d>
              ((MetaVariable *)&local_340,(matrix3d *)local_308);
    break;
  case 0x38:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::matrix4d>
                         (this_01,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x643478697274616d;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    local_308 = (undefined1  [4])0x0;
    fStack_304 = 1.875;
    auStack_300._0_4_ = 0;
    auStack_300._4_4_ = 0;
    auStack_300._8_4_ = 0;
    auStack_300._12_4_ = 0;
    aStack_2f0._M_allocated_capacity = 0;
    aStack_2f0._8_8_ = (undefined1 *)0x0;
    local_2e0 = 0;
    uStack_2dc = 0x3ff00000;
    auStack_2d8._0_4_ = 0;
    auStack_2d8._4_4_ = 0;
    auStack_2d8._8_4_ = 0;
    auStack_2d8._12_4_ = 0;
    auStack_2d8._16_8_ = (undefined1 *)0x0;
    auStack_2d8._24_8_ = (pointer)0x0;
    local_2b8._0_8_ = 0x3ff0000000000000;
    local_2b8._8_8_ = 0;
    local_2b8._16_8_ = (undefined1 *)0x0;
    local_2b8._24_8_ = (pointer)0x0;
    auStack_298._0_8_ = 0;
    auStack_298._8_8_ = 0x3ff0000000000000;
    bVar10 = ReadBasicType(this_01,(matrix4d *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity = 0x643478697274616d;
      goto LAB_00381897;
    }
    MetaVariable::set_value<tinyusdz::value::matrix4d>
              ((MetaVariable *)&local_340,(matrix4d *)local_308);
    break;
  case 0x3a:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::color3f>
                         (this_01,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6633726f6c6f63;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(color3f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x6633726f6c6f63;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<tinyusdz::value::color3f>
              ((MetaVariable *)&local_340,(color3f *)&local_3a8);
    break;
  case 0x3b:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::color3d>
                         (this_01,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6433726f6c6f63;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(color3d *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x6433726f6c6f63;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<tinyusdz::value::color3d>
              ((MetaVariable *)&local_340,(color3d *)&local_3a8);
    break;
  case 0x3d:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::color4f>
                         (this_01,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6634726f6c6f63;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(color4f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x6634726f6c6f63;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<tinyusdz::value::color4f>
              ((MetaVariable *)&local_340,(color4f *)&local_3a8);
    break;
  case 0x3e:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::color4d>
                         (this_01,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6434726f6c6f63;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(color4d *)local_308);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3c8._0_8_ = local_3c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3c8,"Failed to parse a value of type `{}`","");
      local_398._M_allocated_capacity._0_7_ = 0x6434726f6c6f63;
      goto LAB_0037fd8e;
    }
    MetaVariable::set_value<tinyusdz::value::color4d>
              ((MetaVariable *)&local_340,(color4d *)local_308);
    break;
  case 0x3f:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::point3h>
                         (this_01,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6833746e696f70;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(point3h *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x6833746e696f70;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<tinyusdz::value::point3h>
              ((MetaVariable *)&local_340,(point3h *)&local_3a8);
    break;
  case 0x40:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::point3f>
                         (this_01,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6633746e696f70;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(point3f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x6633746e696f70;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<tinyusdz::value::point3f>
              ((MetaVariable *)&local_340,(point3f *)&local_3a8);
    break;
  case 0x41:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::point3d>
                         (this_01,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        stack0xfffffffffffffc48 = (pointer)0x6433746e696f70;
        goto LAB_00381605;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(point3d *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      stack0xfffffffffffffc48 = (pointer)0x6433746e696f70;
      goto LAB_003816e8;
    }
    MetaVariable::set_value<tinyusdz::value::point3d>
              ((MetaVariable *)&local_340,(point3d *)&local_3a8);
    break;
  case 0x42:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::normal3h>
                         (this_01,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x68336c616d726f6e;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(normal3h *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x68336c616d726f6e;
      goto LAB_00381cce;
    }
    MetaVariable::set_value<tinyusdz::value::normal3h>
              ((MetaVariable *)&local_340,(normal3h *)&local_3a8);
    break;
  case 0x43:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::normal3f>
                         (this_01,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x66336c616d726f6e;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(normal3f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x66336c616d726f6e;
      goto LAB_00381cce;
    }
    MetaVariable::set_value<tinyusdz::value::normal3f>
              ((MetaVariable *)&local_340,(normal3f *)&local_3a8);
    break;
  case 0x44:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::normal3d>
                         (this_01,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x64336c616d726f6e;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(normal3d *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x64336c616d726f6e;
      goto LAB_00381cce;
    }
    MetaVariable::set_value<tinyusdz::value::normal3d>
              ((MetaVariable *)&local_340,(normal3d *)&local_3a8);
    break;
  case 0x45:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::vector3h>
                         (this_01,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x6833726f74636576;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(vector3h *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x6833726f74636576;
      goto LAB_00381cce;
    }
    MetaVariable::set_value<tinyusdz::value::vector3h>
              ((MetaVariable *)&local_340,(vector3h *)&local_3a8);
    break;
  case 0x46:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::vector3f>
                         (this_01,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x6633726f74636576;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(vector3f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x6633726f74636576;
      goto LAB_00381cce;
    }
    MetaVariable::set_value<tinyusdz::value::vector3f>
              ((MetaVariable *)&local_340,(vector3f *)&local_3a8);
    break;
  case 0x47:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::vector3d>
                         (this_01,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        register0x00000000 = (pointer)0x6433726f74636576;
        goto LAB_00381bed;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 &local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(vector3d *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      register0x00000000 = (pointer)0x6433726f74636576;
      goto LAB_00381cce;
    }
    MetaVariable::set_value<tinyusdz::value::vector3d>
              ((MetaVariable *)&local_340,(vector3d *)&local_3a8);
    break;
  case 0x49:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::texcoord2h>
                         (this_01,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3b0 = 0x6832;
LAB_00381dba:
        stack0xfffffffffffffc48 = (pointer)0x64726f6f43786574;
        local_3c8._8_8_ = (pointer)0xa;
        local_3ae = '\0';
        goto LAB_00381dc7;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(texcoord2h *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3b0 = 0x6832;
LAB_00381fb3:
      stack0xfffffffffffffc48 = (pointer)0x64726f6f43786574;
      local_3c8._8_8_ = (pointer)0xa;
      local_3ae = '\0';
      goto LAB_00381fc0;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord2h>
              ((MetaVariable *)&local_340,(texcoord2h *)&local_3a8);
    break;
  case 0x4a:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::texcoord2f>
                         (this_01,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3b0 = 0x6632;
        goto LAB_00381dba;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(texcoord2f *)&local_3a8._M_allocated_capacity);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3b0 = 0x6632;
      goto LAB_00381fb3;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord2f>
              ((MetaVariable *)&local_340,(texcoord2f *)&local_3a8._M_allocated_capacity);
    break;
  case 0x4b:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::texcoord2d>
                         (this_01,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3b0 = 0x6432;
        goto LAB_00381dba;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(texcoord2d *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3b0 = 0x6432;
      goto LAB_00381fb3;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord2d>
              ((MetaVariable *)&local_340,(texcoord2d *)&local_3a8);
    break;
  case 0x4c:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::texcoord3h>
                         (this_01,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3b0 = 0x6833;
        goto LAB_00381dba;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(texcoord3h *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3b0 = 0x6833;
      goto LAB_00381fb3;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord3h>
              ((MetaVariable *)&local_340,(texcoord3h *)&local_3a8);
    break;
  case 0x4d:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::texcoord3f>
                         (this_01,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3b0 = 0x6633;
        goto LAB_00381dba;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(texcoord3f *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3b0 = 0x6633;
      goto LAB_00381fb3;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord3f>
              ((MetaVariable *)&local_340,(texcoord3f *)&local_3a8);
    break;
  case 0x4e:
    if (bVar10) {
      local_3a8._M_allocated_capacity = 0;
      local_3a8._8_8_ = 0;
      local_398._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::texcoord3d>
                         (this_01,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                                   *)&local_3a8);
      if (!bVar10) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3f8,"Failed to parse a value of type `{}[]`","");
        local_3b0 = 0x6433;
        goto LAB_00381dba;
      }
      MetaVariable::
      set_value<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                ((MetaVariable *)&local_340,
                 (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  *)&local_3a8);
      goto LAB_00381ebd;
    }
    bVar10 = ReadBasicType(this_01,(texcoord3d *)&local_3a8);
    if (!bVar10) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xac1);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3f8,"Failed to parse a value of type `{}`","");
      local_3b0 = 0x6433;
      goto LAB_00381fb3;
    }
    MetaVariable::set_value<tinyusdz::value::texcoord3d>
              ((MetaVariable *)&local_340,(texcoord3d *)&local_3a8);
    break;
  case 0x51:
    if (bVar10) {
      local_3f8._M_dataplus._M_p = (pointer)0x0;
      local_3f8._M_string_length = 0;
      local_3f8.field_2._M_allocated_capacity = 0;
      bVar10 = ParseBasicTypeArray<tinyusdz::value::AssetPath>
                         (this_01,(vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                                   *)&local_3f8);
      if (bVar10) {
        MetaVariable::
        set_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                  ((MetaVariable *)&local_340,
                   (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                    *)&local_3f8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xad6);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Failed to parse `asset[]`",0x19);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_01,(string *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_local_308 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(auStack_300 + 8)) {
          operator_delete(_local_308,CONCAT44(auStack_300._12_4_,auStack_300._8_4_) + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              &local_3f8);
    }
    else {
      _local_308 = auStack_300 + 8;
      auStack_300._0_4_ = 0;
      auStack_300._4_4_ = 0;
      auStack_300._8_4_ = (uint)(uint3)auStack_300._9_3_ << 8;
      aStack_2f0._8_8_ = auStack_2d8;
      local_2e0 = 0;
      uStack_2dc = 0;
      auStack_2d8._0_4_ = (uint)(uint3)auStack_2d8._1_3_ << 8;
      bVar10 = ReadBasicType(this_01,(AssetPath *)local_308);
      if (bVar10) {
        MetaVariable::set_value<tinyusdz::value::AssetPath>
                  ((MetaVariable *)&local_340,(AssetPath *)local_308);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"ParseMetaValue",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
        poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xadc);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b0,"Failed to parse `asset`",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this_01,(string *)&local_3f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
        ::std::ios_base::~ios_base(local_140);
      }
      tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_308);
    }
    break;
  case 0x52:
    aStack_2f0._M_allocated_capacity = (size_type)auStack_300;
    auStack_300._0_4_ = 0;
    auStack_300._8_4_ = 0;
    auStack_300._12_4_ = 0;
    local_2e0 = 0;
    uStack_2dc = 0;
    aStack_2f0._8_8_ = aStack_2f0._M_allocated_capacity;
    bVar10 = ParseDict(this_01,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                *)local_308);
    if (bVar10) {
      MetaVariable::
      set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                ((MetaVariable *)&local_340,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                  *)local_308);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"ParseMetaValue",0xe);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)&local_1b0,0xae7);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0,"Failed to parse `dictionary`",0x1c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this_01,(string *)&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
      ::std::ios_base::~ios_base(local_140);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                *)local_308,(_Link_type)CONCAT44(auStack_300._12_4_,auStack_300._8_4_));
  }
LAB_003820b6:
  if (bVar10 == false) {
LAB_0037ef38:
    bVar10 = false;
  }
  else {
LAB_003820bf:
    this_00 = local_38;
    ::std::__cxx11::string::_M_assign((string *)&local_38->_name);
    linb::any::operator=((any *)this_00,(any *)&local_340);
    bVar10 = true;
  }
LAB_003820ea:
  if (local_328 != &local_318) {
    operator_delete(local_328,
                    CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1);
  }
  if (local_330 != (undefined **)0x0) {
    (*(code *)local_330[4])(&local_340);
    local_330 = (undefined **)0x0;
  }
  if (local_360[0] != local_350) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  return bVar10;
}

Assistant:

bool AsciiParser::ParseMetaValue(const VariableDef &def, MetaVariable *outvar) {
  std::string vartype = def.type;
  const std::string varname = def.name;

  MetaVariable var;

  bool array_qual{false};

  DCOUT("parseMeta: vartype " << vartype);

  if (endsWith(vartype, "[]")) {
    vartype = removeSuffix(vartype, "[]");
    array_qual = true;
  } else if (def.allow_array_type) {  // variable can be array
    // Seek '['
    char c;
    if (LookChar1(&c)) {
      if (c == '[') {
        array_qual = true;
      }
    }
  }

  uint32_t tyid = value::GetTypeId(vartype);

#define PARSE_BASE_TYPE(__ty)                                     \
  case value::TypeTraits<__ty>::type_id(): {                      \
    if (array_qual) {                                             \
      std::vector<__ty> vss;                                      \
      if (!ParseBasicTypeArray(&vss)) {                           \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}[]`", \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(vss);                                         \
    } else {                                                      \
      __ty val;                                                   \
      if (!ReadBasicType(&val)) {                                 \
        PUSH_ERROR_AND_RETURN(                                    \
            fmt::format("Failed to parse a value of type `{}`",   \
                        value::TypeTraits<__ty>::type_name()));   \
      }                                                           \
      var.set_value(val);                                         \
    }                                                             \
    break;                                                        \
  }

  // Special treatment for "Reference" and "Payload"
  if (vartype == "Reference") {
    if (array_qual) {
      std::vector<Reference> refs;
      if (!ParseBasicTypeArray(&refs)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      var.set_value(refs);
    } else {
      nonstd::optional<Reference> ref;
      if (!ReadBasicType(&ref)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      if (ref) {
        var.set_value(ref.value());
      } else {
        // None
        var.set_value(value::ValueBlock());
      }
    }
  } else if (vartype == "Payload") {
    if (array_qual) {
      std::vector<Payload> refs;
      if (!ParseBasicTypeArray(&refs)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      var.set_value(refs);
    } else {
      nonstd::optional<Payload> ref;
      if (!ReadBasicType(&ref)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadataum.", def.name));
      }
      if (ref) {
        var.set_value(ref.value());
      } else {
        // None
        var.set_value(value::ValueBlock());
      }
    }
  } else if (vartype == value::kPath) {
    if (array_qual) {
      std::vector<Path> paths;
      if (!ParseBasicTypeArray(&paths)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadatum.", def.name));
      }
      var.set_value(paths);

    } else {
      Path path;
      if (!ReadBasicType(&path)) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Failed to parse `{}` in Prim metadatum.", def.name));
      }
      var.set_value(path);
    }
  } else {
    switch (tyid) {
      APPLY_TO_METAVARIABLE_TYPE(PARSE_BASE_TYPE)
      case value::TYPE_ID_STRING: {
        if (array_qual) {
          std::vector<std::string> strs;
          if (!ParseBasicTypeArray(&strs)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `string[]`");
          }
          var.set_value(strs);
        } else {
          std::string str;
          if (!ReadBasicType(&str)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `string`");
          }
          var.set_value(str);
        }
        break;
      }
      case value::TYPE_ID_ASSET_PATH: {
        if (array_qual) {
          std::vector<value::AssetPath> arrs;
          if (!ParseBasicTypeArray(&arrs)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `asset[]`");
          }
          var.set_value(arrs);
        } else {
          value::AssetPath asset;
          if (!ReadBasicType(&asset)) {
            PUSH_ERROR_AND_RETURN("Failed to parse `asset`");
          }
          var.set_value(asset);
        }
        break;
      }
      case value::TYPE_ID_DICT: {
        Dictionary dict;

        DCOUT("Parse dictionary");
        if (!ParseDict(&dict)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `dictionary`");
        }
        var.set_value(dict);
        break;
      }
      default: {
        std::string tyname = vartype;
        if (array_qual) {
          tyname += "[]";
        }
        PUSH_ERROR_AND_RETURN("Unsupported or invalid type for Metadatum:" +
                              tyname);
      }
    }
  }

#undef PARSE_BASE_TYPE

  (*outvar) = var;

  return true;
}